

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrans_avx2.c
# Opt level: O0

void itrans_dct2_h4_w16_avx2(s16 *src,s16 *dst,int bit_depth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined8 uVar19;
  s16 *psVar20;
  int in_EDX;
  s16 *in_RSI;
  long in_RDI;
  undefined1 auVar21 [32];
  s16 tmp [64];
  __m256i min_val;
  __m256i max_val;
  int i_src3;
  int i_src2;
  int i_src;
  int j;
  __m256i off;
  __m256i c16_p32_p32;
  __m256i c16_n32_p32;
  __m256i c16_n42_p17;
  __m256i c16_p17_p42;
  __m256i v3;
  __m256i v2;
  __m256i v1;
  __m256i v0;
  __m256i t1;
  __m256i t0;
  __m256i o1;
  __m256i o0;
  __m256i e1;
  __m256i e0;
  __m128i ss3;
  __m128i ss2;
  __m128i ss1;
  __m128i ss0;
  __m128i s3;
  __m128i s2;
  __m128i s1;
  __m128i s0;
  s16 local_dc0 [70];
  int local_d34;
  s16 *local_d30;
  undefined1 local_d20 [16];
  undefined1 auStack_d10 [16];
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  int local_cd0;
  int local_ccc;
  int local_cc8;
  int local_cc4;
  undefined1 local_cc0 [16];
  undefined1 auStack_cb0 [16];
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined1 local_c20 [32];
  undefined1 local_c00 [32];
  undefined1 local_be0 [32];
  undefined1 local_bc0 [32];
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [16];
  undefined1 local_ad0 [16];
  undefined1 local_ac0 [16];
  undefined1 local_ab0 [16];
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 local_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 local_a70;
  undefined8 uStack_a68;
  int local_a54;
  uint local_a50;
  int local_a4c;
  s16 *local_a48;
  long local_a40;
  undefined4 local_a34;
  undefined4 local_a30;
  undefined4 local_a2c;
  undefined4 local_a28;
  undefined4 local_a24;
  undefined1 (*local_a20) [16];
  undefined1 (*local_a18) [16];
  undefined1 (*local_a10) [16];
  undefined1 (*local_a08) [16];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 local_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 local_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined1 local_860 [16];
  undefined1 auStack_850 [16];
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined1 local_820 [16];
  undefined1 auStack_810 [16];
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined1 local_7e0 [16];
  undefined1 auStack_7d0 [16];
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined1 local_7a0 [16];
  undefined1 auStack_790 [16];
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  uint local_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  uint local_604;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  uint local_5c4;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  uint local_584;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  ushort local_444;
  ushort local_442;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [16];
  undefined1 auStack_3b0 [16];
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [16];
  undefined1 auStack_370 [16];
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  undefined4 local_2e0;
  undefined4 local_2dc;
  undefined4 local_2d8;
  undefined4 local_2d4;
  undefined4 local_2d0;
  undefined4 local_2cc;
  undefined4 local_2c8;
  undefined4 local_2c4;
  undefined1 local_2c0 [16];
  undefined1 auStack_2b0 [16];
  undefined4 local_2a0;
  undefined4 local_29c;
  undefined4 local_298;
  undefined4 local_294;
  undefined4 local_290;
  undefined4 local_28c;
  undefined4 local_288;
  undefined4 local_284;
  undefined1 local_280 [16];
  undefined1 auStack_270 [16];
  undefined4 local_260;
  undefined4 local_25c;
  undefined4 local_258;
  undefined4 local_254;
  undefined4 local_250;
  undefined4 local_24c;
  undefined4 local_248;
  undefined4 local_244;
  undefined1 local_240 [16];
  undefined1 auStack_230 [16];
  undefined4 local_220;
  undefined4 local_21c;
  undefined4 local_218;
  undefined4 local_214;
  undefined4 local_210;
  undefined4 local_20c;
  undefined4 local_208;
  undefined4 local_204;
  undefined1 local_200 [16];
  undefined1 auStack_1f0 [16];
  undefined4 local_1e0;
  undefined4 local_1dc;
  undefined4 local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  undefined4 local_1cc;
  undefined4 local_1c8;
  undefined4 local_1c4;
  undefined1 local_1c0 [32];
  ushort local_1a0;
  ushort local_19e;
  ushort local_19c;
  ushort local_19a;
  ushort local_198;
  ushort local_196;
  ushort local_194;
  ushort local_192;
  ushort local_190;
  ushort local_18e;
  ushort local_18c;
  ushort local_18a;
  ushort local_188;
  ushort local_186;
  ushort local_184;
  ushort local_182;
  undefined1 local_180 [16];
  undefined1 auStack_170 [16];
  ushort local_160;
  ushort local_15e;
  ushort local_15c;
  ushort local_15a;
  ushort local_158;
  ushort local_156;
  ushort local_154;
  ushort local_152;
  ushort local_150;
  ushort local_14e;
  ushort local_14c;
  ushort local_14a;
  ushort local_148;
  ushort local_146;
  ushort local_144;
  ushort local_142;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  s16 *local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 *local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  s16 *local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  s16 *local_38;
  
  auVar21._24_8_ = auStack_d10._8_8_;
  auVar21._16_8_ = auStack_d10._0_8_;
  auVar21._8_8_ = local_d20._8_8_;
  auVar21._0_8_ = local_d20._0_8_;
  local_a48 = local_dc0;
  local_a4c = 0x10;
  local_a50 = 5;
  local_a54 = 0xf;
  local_a24 = 0x11002a;
  local_1c4 = 0x11002a;
  local_1c8 = 0x11002a;
  local_1cc = 0x11002a;
  local_1d0 = 0x11002a;
  local_1d4 = 0x11002a;
  local_1d8 = 0x11002a;
  local_1dc = 0x11002a;
  local_1e0 = 0x11002a;
  auVar1 = vpinsrd_avx(ZEXT416(0x11002a),0x11002a,1);
  auVar1 = vpinsrd_avx(auVar1,0x11002a,2);
  local_200 = vpinsrd_avx(auVar1,0x11002a,3);
  auVar1 = vpinsrd_avx(ZEXT416(0x11002a),0x11002a,1);
  auVar1 = vpinsrd_avx(auVar1,0x11002a,2);
  auStack_1f0 = vpinsrd_avx(auVar1,0x11002a,3);
  local_c40 = local_200._0_8_;
  uStack_c38 = local_200._8_8_;
  uStack_c30 = auStack_1f0._0_8_;
  uStack_c28 = auStack_1f0._8_8_;
  local_a28 = 0xffd60011;
  local_204 = 0xffd60011;
  local_208 = 0xffd60011;
  local_20c = 0xffd60011;
  local_210 = 0xffd60011;
  local_214 = 0xffd60011;
  local_218 = 0xffd60011;
  local_21c = 0xffd60011;
  local_220 = 0xffd60011;
  auVar1 = vpinsrd_avx(ZEXT416(0xffd60011),0xffd60011,1);
  auVar1 = vpinsrd_avx(auVar1,0xffd60011,2);
  local_240 = vpinsrd_avx(auVar1,0xffd60011,3);
  auVar1 = vpinsrd_avx(ZEXT416(0xffd60011),0xffd60011,1);
  auVar1 = vpinsrd_avx(auVar1,0xffd60011,2);
  auStack_230 = vpinsrd_avx(auVar1,0xffd60011,3);
  local_c60 = local_240._0_8_;
  uStack_c58 = local_240._8_8_;
  uStack_c50 = auStack_230._0_8_;
  uStack_c48 = auStack_230._8_8_;
  local_a2c = 0xffe00020;
  local_244 = 0xffe00020;
  local_248 = 0xffe00020;
  local_24c = 0xffe00020;
  local_250 = 0xffe00020;
  local_254 = 0xffe00020;
  local_258 = 0xffe00020;
  local_25c = 0xffe00020;
  local_260 = 0xffe00020;
  auVar1 = vpinsrd_avx(ZEXT416(0xffe00020),0xffe00020,1);
  auVar1 = vpinsrd_avx(auVar1,0xffe00020,2);
  local_280 = vpinsrd_avx(auVar1,0xffe00020,3);
  auVar1 = vpinsrd_avx(ZEXT416(0xffe00020),0xffe00020,1);
  auVar1 = vpinsrd_avx(auVar1,0xffe00020,2);
  auStack_270 = vpinsrd_avx(auVar1,0xffe00020,3);
  local_c80 = local_280._0_8_;
  uStack_c78 = local_280._8_8_;
  uStack_c70 = auStack_270._0_8_;
  uStack_c68 = auStack_270._8_8_;
  local_a30 = 0x200020;
  local_284 = 0x200020;
  local_288 = 0x200020;
  local_28c = 0x200020;
  local_290 = 0x200020;
  local_294 = 0x200020;
  local_298 = 0x200020;
  local_29c = 0x200020;
  local_2a0 = 0x200020;
  auVar1 = vpinsrd_avx(ZEXT416(0x200020),0x200020,1);
  auVar1 = vpinsrd_avx(auVar1,0x200020,2);
  local_2c0 = vpinsrd_avx(auVar1,0x200020,3);
  auVar1 = vpinsrd_avx(ZEXT416(0x200020),0x200020,1);
  auVar1 = vpinsrd_avx(auVar1,0x200020,2);
  auStack_2b0 = vpinsrd_avx(auVar1,0x200020,3);
  local_ca0 = local_2c0._0_8_;
  uStack_c98 = local_2c0._8_8_;
  uStack_c90 = auStack_2b0._0_8_;
  uStack_c88 = auStack_2b0._8_8_;
  local_a34 = 0x10;
  auVar1 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
  auVar1 = vpinsrd_avx(auVar1,0x10,2);
  auVar1 = vpinsrd_avx(auVar1,0x10,3);
  auVar2 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
  auVar2 = vpinsrd_avx(auVar2,0x10,2);
  auVar2 = vpinsrd_avx(auVar2,0x10,3);
  local_300._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  local_300._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  local_cc8 = 0x10;
  local_ccc = 0x20;
  local_cd0 = 0x30;
  local_cc4 = 0;
  local_d34 = in_EDX;
  local_d30 = in_RSI;
  local_a40 = in_RDI;
  local_2e0 = local_a34;
  local_2dc = local_a34;
  local_2d8 = local_a34;
  local_2d4 = local_a34;
  local_2d0 = local_a34;
  local_2cc = local_a34;
  local_2c8 = local_a34;
  local_2c4 = local_a34;
  local_cc0 = local_300._0_16_;
  auStack_cb0 = local_300._16_16_;
  while( true ) {
    psVar20 = local_a48;
    if (local_a4c <= local_cc4) break;
    local_a08 = (undefined1 (*) [16])(local_a40 + (long)local_cc4 * 2);
    local_a70 = *(undefined8 *)*local_a08;
    uStack_a68 = *(undefined8 *)(*local_a08 + 8);
    local_a10 = (undefined1 (*) [16])(local_a40 + (long)local_cc8 * 2 + (long)local_cc4 * 2);
    local_a80 = *(undefined8 *)*local_a10;
    uStack_a78 = *(undefined8 *)(*local_a10 + 8);
    local_a18 = (undefined1 (*) [16])(local_a40 + (long)local_ccc * 2 + (long)local_cc4 * 2);
    local_a90 = *(undefined8 *)*local_a18;
    uStack_a88 = *(undefined8 *)(*local_a18 + 8);
    local_a20 = (undefined1 (*) [16])(local_a40 + (long)local_cd0 * 2 + (long)local_cc4 * 2);
    local_aa0 = *(undefined8 *)*local_a20;
    uStack_a98 = *(undefined8 *)(*local_a20 + 8);
    local_ab0 = vpunpcklwd_avx(*local_a08,*local_a18);
    local_ac0 = vpunpckhwd_avx(*local_a08,*local_a18);
    local_ad0 = vpunpcklwd_avx(*local_a10,*local_a20);
    local_ae0 = vpunpckhwd_avx(*local_a10,*local_a20);
    local_970 = local_ab0._0_8_;
    uStack_968 = local_ab0._8_8_;
    uStack_b70 = local_ac0._0_8_;
    uStack_b68 = local_ac0._8_8_;
    local_b80 = local_ab0._0_8_;
    uStack_b78 = local_ab0._8_8_;
    local_980 = local_ad0._0_8_;
    uStack_978 = local_ad0._8_8_;
    uStack_b90 = local_ae0._0_8_;
    uStack_b88 = local_ae0._8_8_;
    local_ba0 = local_ad0._0_8_;
    uStack_b98 = local_ad0._8_8_;
    local_880 = local_ab0._0_8_;
    uStack_878 = local_ab0._8_8_;
    uStack_870 = local_ac0._0_8_;
    uStack_868 = local_ac0._8_8_;
    local_8a0 = local_ca0;
    uStack_898 = uStack_c98;
    uStack_890 = uStack_c90;
    uStack_888 = uStack_c88;
    auVar10._16_8_ = local_ac0._0_8_;
    auVar10._0_16_ = local_ab0;
    auVar10._24_8_ = local_ac0._8_8_;
    auVar9._8_8_ = uStack_c98;
    auVar9._0_8_ = local_ca0;
    auVar9._16_8_ = uStack_c90;
    auVar9._24_8_ = uStack_c88;
    local_b00 = vpmaddwd_avx2(auVar10,auVar9);
    local_8c0 = local_ab0._0_8_;
    uStack_8b8 = local_ab0._8_8_;
    uStack_8b0 = local_ac0._0_8_;
    uStack_8a8 = local_ac0._8_8_;
    local_8e0 = local_c80;
    uStack_8d8 = uStack_c78;
    uStack_8d0 = uStack_c70;
    uStack_8c8 = uStack_c68;
    auVar8._16_8_ = local_ac0._0_8_;
    auVar8._0_16_ = local_ab0;
    auVar8._24_8_ = local_ac0._8_8_;
    auVar7._8_8_ = uStack_c78;
    auVar7._0_8_ = local_c80;
    auVar7._16_8_ = uStack_c70;
    auVar7._24_8_ = uStack_c68;
    local_b20 = vpmaddwd_avx2(auVar8,auVar7);
    local_900 = local_ad0._0_8_;
    uStack_8f8 = local_ad0._8_8_;
    uStack_8f0 = local_ae0._0_8_;
    uStack_8e8 = local_ae0._8_8_;
    local_920 = local_c40;
    uStack_918 = uStack_c38;
    uStack_910 = uStack_c30;
    uStack_908 = uStack_c28;
    auVar6._16_8_ = local_ae0._0_8_;
    auVar6._0_16_ = local_ad0;
    auVar6._24_8_ = local_ae0._8_8_;
    auVar5._8_8_ = uStack_c38;
    auVar5._0_8_ = local_c40;
    auVar5._16_8_ = uStack_c30;
    auVar5._24_8_ = uStack_c28;
    local_b40 = vpmaddwd_avx2(auVar6,auVar5);
    local_940 = local_ad0._0_8_;
    uStack_938 = local_ad0._8_8_;
    uStack_930 = local_ae0._0_8_;
    uStack_928 = local_ae0._8_8_;
    local_960 = local_c60;
    uStack_958 = uStack_c58;
    uStack_950 = uStack_c50;
    uStack_948 = uStack_c48;
    auVar4._16_8_ = local_ae0._0_8_;
    auVar4._0_16_ = local_ad0;
    auVar4._24_8_ = local_ae0._8_8_;
    auVar3._8_8_ = uStack_c58;
    auVar3._0_8_ = local_c60;
    auVar3._16_8_ = uStack_c50;
    auVar3._24_8_ = uStack_c48;
    local_b60 = vpmaddwd_avx2(auVar4,auVar3);
    local_700 = local_b00._0_8_;
    uStack_6f8 = local_b00._8_8_;
    uStack_6f0 = local_b00._16_8_;
    uStack_6e8 = local_b00._24_8_;
    local_720 = local_b40._0_8_;
    uStack_718 = local_b40._8_8_;
    uStack_710 = local_b40._16_8_;
    uStack_708 = local_b40._24_8_;
    auVar3 = vpaddd_avx2(local_b00,local_b40);
    local_740 = local_b20._0_8_;
    uStack_738 = local_b20._8_8_;
    uStack_730 = local_b20._16_8_;
    uStack_728 = local_b20._24_8_;
    local_760 = local_b60._0_8_;
    uStack_758 = local_b60._8_8_;
    uStack_750 = local_b60._16_8_;
    uStack_748 = local_b60._24_8_;
    auVar4 = vpaddd_avx2(local_b20,local_b60);
    local_680 = local_b20._0_8_;
    uStack_678 = local_b20._8_8_;
    uStack_670 = local_b20._16_8_;
    uStack_668 = local_b20._24_8_;
    local_6a0 = local_b60._0_8_;
    uStack_698 = local_b60._8_8_;
    uStack_690 = local_b60._16_8_;
    uStack_688 = local_b60._24_8_;
    auVar5 = vpsubd_avx2(local_b20,local_b60);
    local_6c0 = local_b00._0_8_;
    uStack_6b8 = local_b00._8_8_;
    uStack_6b0 = local_b00._16_8_;
    uStack_6a8 = local_b00._24_8_;
    local_6e0 = local_b40._0_8_;
    uStack_6d8 = local_b40._8_8_;
    uStack_6d0 = local_b40._16_8_;
    uStack_6c8 = local_b40._24_8_;
    auVar6 = vpsubd_avx2(local_b00,local_b40);
    local_bc0._0_8_ = auVar3._0_8_;
    local_bc0._8_8_ = auVar3._8_8_;
    local_bc0._16_8_ = auVar3._16_8_;
    local_bc0._24_8_ = auVar3._24_8_;
    local_780 = local_bc0._0_8_;
    uStack_778 = local_bc0._8_8_;
    uStack_770 = local_bc0._16_8_;
    uStack_768 = local_bc0._24_8_;
    auVar14._16_8_ = auStack_cb0._0_8_;
    auVar14._0_16_ = local_cc0;
    auVar14._24_8_ = auStack_cb0._8_8_;
    auVar3 = vpaddd_avx2(auVar3,auVar14);
    local_be0._0_8_ = auVar4._0_8_;
    local_be0._8_8_ = auVar4._8_8_;
    local_be0._16_8_ = auVar4._16_8_;
    local_be0._24_8_ = auVar4._24_8_;
    local_7c0 = local_be0._0_8_;
    uStack_7b8 = local_be0._8_8_;
    uStack_7b0 = local_be0._16_8_;
    uStack_7a8 = local_be0._24_8_;
    auVar13._16_8_ = auStack_cb0._0_8_;
    auVar13._0_16_ = local_cc0;
    auVar13._24_8_ = auStack_cb0._8_8_;
    auVar4 = vpaddd_avx2(auVar4,auVar13);
    local_c00._0_8_ = auVar5._0_8_;
    local_c00._8_8_ = auVar5._8_8_;
    local_c00._16_8_ = auVar5._16_8_;
    local_c00._24_8_ = auVar5._24_8_;
    local_800 = local_c00._0_8_;
    uStack_7f8 = local_c00._8_8_;
    uStack_7f0 = local_c00._16_8_;
    uStack_7e8 = local_c00._24_8_;
    auVar12._16_8_ = auStack_cb0._0_8_;
    auVar12._0_16_ = local_cc0;
    auVar12._24_8_ = auStack_cb0._8_8_;
    auVar5 = vpaddd_avx2(auVar5,auVar12);
    local_c20._0_8_ = auVar6._0_8_;
    local_c20._8_8_ = auVar6._8_8_;
    local_c20._16_8_ = auVar6._16_8_;
    local_c20._24_8_ = auVar6._24_8_;
    local_840 = local_c20._0_8_;
    uStack_838 = local_c20._8_8_;
    uStack_830 = local_c20._16_8_;
    uStack_828 = local_c20._24_8_;
    auVar11._16_8_ = auStack_cb0._0_8_;
    auVar11._0_16_ = local_cc0;
    auVar11._24_8_ = auStack_cb0._8_8_;
    auVar6 = vpaddd_avx2(auVar6,auVar11);
    local_bc0._0_8_ = auVar3._0_8_;
    local_bc0._8_8_ = auVar3._8_8_;
    local_bc0._16_8_ = auVar3._16_8_;
    local_bc0._24_8_ = auVar3._24_8_;
    local_580 = local_bc0._0_8_;
    uStack_578 = local_bc0._8_8_;
    uStack_570 = local_bc0._16_8_;
    uStack_568 = local_bc0._24_8_;
    local_584 = local_a50;
    auVar3 = vpsrad_avx2(auVar3,ZEXT416(local_a50));
    local_be0._0_8_ = auVar4._0_8_;
    local_be0._8_8_ = auVar4._8_8_;
    local_be0._16_8_ = auVar4._16_8_;
    local_be0._24_8_ = auVar4._24_8_;
    local_5c0 = local_be0._0_8_;
    uStack_5b8 = local_be0._8_8_;
    uStack_5b0 = local_be0._16_8_;
    uStack_5a8 = local_be0._24_8_;
    local_5c4 = local_a50;
    auVar4 = vpsrad_avx2(auVar4,ZEXT416(local_a50));
    local_c00._0_8_ = auVar5._0_8_;
    local_c00._8_8_ = auVar5._8_8_;
    local_c00._16_8_ = auVar5._16_8_;
    local_c00._24_8_ = auVar5._24_8_;
    local_600 = local_c00._0_8_;
    uStack_5f8 = local_c00._8_8_;
    uStack_5f0 = local_c00._16_8_;
    uStack_5e8 = local_c00._24_8_;
    local_604 = local_a50;
    auVar5 = vpsrad_avx2(auVar5,ZEXT416(local_a50));
    local_c20._0_8_ = auVar6._0_8_;
    local_c20._8_8_ = auVar6._8_8_;
    local_c20._16_8_ = auVar6._16_8_;
    local_c20._24_8_ = auVar6._24_8_;
    local_640 = local_c20._0_8_;
    uStack_638 = local_c20._8_8_;
    uStack_630 = local_c20._16_8_;
    uStack_628 = local_c20._24_8_;
    local_644 = local_a50;
    auVar6 = vpsrad_avx2(auVar6,ZEXT416(local_a50));
    local_bc0._0_8_ = auVar3._0_8_;
    local_bc0._8_8_ = auVar3._8_8_;
    local_bc0._16_8_ = auVar3._16_8_;
    local_bc0._24_8_ = auVar3._24_8_;
    local_c00._0_8_ = auVar5._0_8_;
    local_c00._8_8_ = auVar5._8_8_;
    local_c00._16_8_ = auVar5._16_8_;
    local_c00._24_8_ = auVar5._24_8_;
    local_500 = local_bc0._0_8_;
    uStack_4f8 = local_bc0._8_8_;
    uStack_4f0 = local_bc0._16_8_;
    uStack_4e8 = local_bc0._24_8_;
    local_520 = local_c00._0_8_;
    uStack_518 = local_c00._8_8_;
    uStack_510 = local_c00._16_8_;
    uStack_508 = local_c00._24_8_;
    auVar3 = vpackssdw_avx2(auVar3,auVar5);
    local_be0._0_8_ = auVar4._0_8_;
    local_be0._8_8_ = auVar4._8_8_;
    local_be0._16_8_ = auVar4._16_8_;
    local_be0._24_8_ = auVar4._24_8_;
    local_c20._0_8_ = auVar6._0_8_;
    local_c20._8_8_ = auVar6._8_8_;
    local_c20._16_8_ = auVar6._16_8_;
    local_c20._24_8_ = auVar6._24_8_;
    local_540 = local_be0._0_8_;
    uStack_538 = local_be0._8_8_;
    uStack_530 = local_be0._16_8_;
    uStack_528 = local_be0._24_8_;
    local_560 = local_c20._0_8_;
    uStack_558 = local_c20._8_8_;
    uStack_550 = local_c20._16_8_;
    uStack_548 = local_c20._24_8_;
    auVar4 = vpackssdw_avx2(auVar4,auVar6);
    local_bc0._0_8_ = auVar3._0_8_;
    local_bc0._8_8_ = auVar3._8_8_;
    local_bc0._16_8_ = auVar3._16_8_;
    local_bc0._24_8_ = auVar3._24_8_;
    local_be0._0_8_ = auVar4._0_8_;
    local_be0._8_8_ = auVar4._8_8_;
    local_be0._16_8_ = auVar4._16_8_;
    local_be0._24_8_ = auVar4._24_8_;
    local_4c0 = local_bc0._0_8_;
    uStack_4b8 = local_bc0._8_8_;
    uStack_4b0 = local_bc0._16_8_;
    uStack_4a8 = local_bc0._24_8_;
    local_4e0 = local_be0._0_8_;
    uStack_4d8 = local_be0._8_8_;
    uStack_4d0 = local_be0._16_8_;
    uStack_4c8 = local_be0._24_8_;
    local_c00 = vpunpcklwd_avx2(auVar3,auVar4);
    local_480 = local_bc0._0_8_;
    uStack_478 = local_bc0._8_8_;
    uStack_470 = local_bc0._16_8_;
    uStack_468 = local_bc0._24_8_;
    local_4a0 = local_be0._0_8_;
    uStack_498 = local_be0._8_8_;
    uStack_490 = local_be0._16_8_;
    uStack_488 = local_be0._24_8_;
    local_c20 = vpunpckhwd_avx2(auVar3,auVar4);
    local_120 = local_c00._0_8_;
    uStack_118 = local_c00._8_8_;
    uStack_110 = local_c00._16_8_;
    uStack_108 = local_c00._24_8_;
    local_140 = local_c20._0_8_;
    uStack_138 = local_c20._8_8_;
    uStack_130 = local_c20._16_8_;
    uStack_128 = local_c20._24_8_;
    local_bc0 = vpunpckldq_avx2(local_c00,local_c20);
    local_e0 = local_c00._0_8_;
    uStack_d8 = local_c00._8_8_;
    uStack_d0 = local_c00._16_8_;
    uStack_c8 = local_c00._24_8_;
    local_100 = local_c20._0_8_;
    uStack_f8 = local_c20._8_8_;
    uStack_f0 = local_c20._16_8_;
    uStack_e8 = local_c20._24_8_;
    local_be0 = vpunpckhdq_avx2(local_c00,local_c20);
    if (local_a54 != 0xf) {
      local_442 = (short)(1 << ((byte)local_a54 & 0x1f)) - 1;
      auVar1 = vpinsrw_avx(ZEXT216(local_442),(uint)local_442,1);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_442,2);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_442,3);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_442,4);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_442,5);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_442,6);
      local_180 = vpinsrw_avx(auVar1,(uint)local_442,7);
      auVar1 = vpinsrw_avx(ZEXT216(local_442),(uint)local_442,1);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_442,2);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_442,3);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_442,4);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_442,5);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_442,6);
      auStack_170 = vpinsrw_avx(auVar1,(uint)local_442,7);
      local_d00 = local_180._0_8_;
      uStack_cf8 = local_180._8_8_;
      uStack_cf0 = auStack_170._0_8_;
      uStack_ce8 = auStack_170._8_8_;
      local_444 = -(short)(1 << ((byte)local_a54 & 0x1f));
      auVar1 = vpinsrw_avx(ZEXT216(local_444),(uint)local_444,1);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_444,2);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_444,3);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_444,4);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_444,5);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_444,6);
      auVar1 = vpinsrw_avx(auVar1,(uint)local_444,7);
      auVar2 = vpinsrw_avx(ZEXT216(local_444),(uint)local_444,1);
      auVar2 = vpinsrw_avx(auVar2,(uint)local_444,2);
      auVar2 = vpinsrw_avx(auVar2,(uint)local_444,3);
      auVar2 = vpinsrw_avx(auVar2,(uint)local_444,4);
      auVar2 = vpinsrw_avx(auVar2,(uint)local_444,5);
      auVar2 = vpinsrw_avx(auVar2,(uint)local_444,6);
      auVar2 = vpinsrw_avx(auVar2,(uint)local_444,7);
      auVar21._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
      auVar21._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
      local_1c0._16_8_ = auVar21._16_8_;
      local_1c0._24_8_ = auVar21._24_8_;
      local_3e0 = local_bc0._0_8_;
      uStack_3d8 = local_bc0._8_8_;
      uStack_3d0 = local_bc0._16_8_;
      uStack_3c8 = local_bc0._24_8_;
      local_400 = local_180._0_8_;
      uStack_3f8 = local_180._8_8_;
      uStack_3f0 = auStack_170._0_8_;
      uStack_3e8 = auStack_170._8_8_;
      auVar16._16_8_ = auStack_170._0_8_;
      auVar16._0_16_ = local_180;
      auVar16._24_8_ = auStack_170._8_8_;
      auVar3 = vpminsw_avx2(local_bc0,auVar16);
      local_420 = local_be0._0_8_;
      uStack_418 = local_be0._8_8_;
      uStack_410 = local_be0._16_8_;
      uStack_408 = local_be0._24_8_;
      local_440 = local_180._0_8_;
      uStack_438 = local_180._8_8_;
      uStack_430 = auStack_170._0_8_;
      uStack_428 = auStack_170._8_8_;
      auVar15._16_8_ = auStack_170._0_8_;
      auVar15._0_16_ = local_180;
      auVar15._24_8_ = auStack_170._8_8_;
      auVar4 = vpminsw_avx2(local_be0,auVar15);
      local_bc0._0_8_ = auVar3._0_8_;
      local_bc0._8_8_ = auVar3._8_8_;
      local_bc0._16_8_ = auVar3._16_8_;
      local_bc0._24_8_ = auVar3._24_8_;
      local_360 = local_bc0._0_8_;
      uStack_358 = local_bc0._8_8_;
      uStack_350 = local_bc0._16_8_;
      uStack_348 = local_bc0._24_8_;
      auVar18._16_8_ = local_1c0._16_8_;
      auVar18._0_16_ = auVar21._0_16_;
      auVar18._24_8_ = local_1c0._24_8_;
      local_bc0 = vpmaxsw_avx2(auVar3,auVar18);
      local_be0._0_8_ = auVar4._0_8_;
      local_be0._8_8_ = auVar4._8_8_;
      local_be0._16_8_ = auVar4._16_8_;
      local_be0._24_8_ = auVar4._24_8_;
      local_3a0 = local_be0._0_8_;
      uStack_398 = local_be0._8_8_;
      uStack_390 = local_be0._16_8_;
      uStack_388 = local_be0._24_8_;
      auVar17._16_8_ = local_1c0._16_8_;
      auVar17._0_16_ = auVar21._0_16_;
      auVar17._24_8_ = local_1c0._24_8_;
      local_be0 = vpmaxsw_avx2(auVar4,auVar17);
      local_1c0 = auVar21;
      local_1a0 = local_444;
      local_19e = local_444;
      local_19c = local_444;
      local_19a = local_444;
      local_198 = local_444;
      local_196 = local_444;
      local_194 = local_444;
      local_192 = local_444;
      local_190 = local_444;
      local_18e = local_444;
      local_18c = local_444;
      local_18a = local_444;
      local_188 = local_444;
      local_186 = local_444;
      local_184 = local_444;
      local_182 = local_444;
      local_160 = local_442;
      local_15e = local_442;
      local_15c = local_442;
      local_15a = local_442;
      local_158 = local_442;
      local_156 = local_442;
      local_154 = local_442;
      local_152 = local_442;
      local_150 = local_442;
      local_14e = local_442;
      local_14c = local_442;
      local_14a = local_442;
      local_148 = local_442;
      local_146 = local_442;
      local_144 = local_442;
      local_142 = local_442;
      local_380 = auVar21._0_16_;
      auStack_370 = auVar21._16_16_;
      local_3c0 = auVar21._0_16_;
      auStack_3b0 = auVar21._16_16_;
    }
    uVar19 = local_bc0._8_8_;
    local_320 = local_bc0._0_8_;
    uStack_318 = local_bc0._8_8_;
    uStack_310 = local_bc0._16_8_;
    uStack_308 = local_bc0._24_8_;
    local_38 = local_a48;
    local_50 = local_bc0._0_8_;
    uStack_48 = local_bc0._8_8_;
    local_a00 = local_aa0;
    uStack_9f8 = uStack_a98;
    local_9f0 = local_a80;
    uStack_9e8 = uStack_a78;
    local_9e0 = local_a90;
    uStack_9d8 = uStack_a88;
    local_9d0 = local_a70;
    uStack_9c8 = uStack_a68;
    local_9c0 = local_aa0;
    uStack_9b8 = uStack_a98;
    local_9b0 = local_a80;
    uStack_9a8 = uStack_a78;
    local_9a0 = local_a90;
    uStack_998 = uStack_a88;
    local_990 = local_a70;
    uStack_988 = uStack_a68;
    local_d20 = auVar21._0_16_;
    auStack_d10 = auVar21._16_16_;
    local_7a0 = local_cc0;
    auStack_790 = auStack_cb0;
    local_7e0 = local_cc0;
    auStack_7d0 = auStack_cb0;
    local_820 = local_cc0;
    auStack_810 = auStack_cb0;
    local_860 = local_cc0;
    auStack_850 = auStack_cb0;
    *(undefined8 *)local_a48 = local_bc0._0_8_;
    *(undefined8 *)(psVar20 + 4) = uVar19;
    psVar20 = local_a48;
    local_58 = local_a48 + 8;
    uVar19 = local_be0._8_8_;
    local_340 = local_be0._0_8_;
    uStack_338 = local_be0._8_8_;
    uStack_330 = local_be0._16_8_;
    uStack_328 = local_be0._24_8_;
    local_70 = local_be0._0_8_;
    uStack_68 = local_be0._8_8_;
    *(undefined8 *)local_58 = local_be0._0_8_;
    *(undefined8 *)(psVar20 + 0xc) = uVar19;
    psVar20 = local_a48;
    local_78 = (undefined8 *)local_bc0._24_8_;
    uStack_80 = local_bc0._16_8_;
    *(undefined8 *)local_bc0._24_8_ = local_90;
    *(undefined8 *)(local_bc0._24_8_ + 8) = uStack_88;
    local_98 = local_a48 + 0x18;
    uVar19 = local_be0._24_8_;
    local_b0 = local_be0._16_8_;
    uStack_a8 = local_be0._24_8_;
    *(undefined8 *)local_98 = local_be0._16_8_;
    *(undefined8 *)(psVar20 + 0x1c) = uVar19;
    local_a48 = local_a48 + 0x20;
    local_cc4 = local_cc4 + 8;
    auVar21._0_16_ = local_d20;
    auVar21._16_16_ = auStack_d10;
  }
  local_d20 = auVar21._0_16_;
  auStack_d10 = auVar21._16_16_;
  dct2_butterfly_h16_sse(local_dc0,4,local_d30,4,0x14 - local_d34,local_d34);
  return;
}

Assistant:

void itrans_dct2_h4_w16_avx2(s16 *src, s16 *dst, int bit_depth)
{
    ALIGNED_32(s16 tmp[4 * 16]);
    dct2_butterfly_h4_avx2(src, tmp, 16, 5, MAX_TX_DYNAMIC_RANGE);
    dct2_butterfly_h16_sse(tmp, 4, dst, 4, 20 - bit_depth, bit_depth);
}